

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CordInputStream::ReadCord(CordInputStream *this,Cord *cord,int count)

{
  Cord *pCVar1;
  unsigned_long *puVar2;
  Cord local_48;
  unsigned_long local_38;
  size_t local_30;
  size_t n;
  size_t used;
  Cord *pCStack_18;
  int count_local;
  Cord *cord_local;
  CordInputStream *this_local;
  
  n = this->size_ - this->available_;
  used._4_4_ = count;
  pCStack_18 = cord;
  cord_local = (Cord *)this;
  absl::lts_20240722::Cord::Advance(&this->it_,n);
  local_38 = (unsigned_long)used._4_4_;
  puVar2 = std::min<unsigned_long>(&local_38,&this->bytes_remaining_);
  pCVar1 = pCStack_18;
  local_30 = *puVar2;
  absl::lts_20240722::Cord::AdvanceAndRead(&local_48,&this->it_,local_30);
  absl::lts_20240722::Cord::Append(pCVar1);
  absl::lts_20240722::Cord::~Cord(&local_48);
  this->bytes_remaining_ = this->bytes_remaining_ - local_30;
  LoadChunkData(this);
  return local_30 == (long)used._4_4_;
}

Assistant:

bool CordInputStream::ReadCord(absl::Cord* cord, int count) {
  // Advance the iterator to the current position
  const size_t used = size_ - available_;
  absl::Cord::Advance(&it_, used);

  // Read the cord, adjusting the iterator position.
  // Make sure to cap at available bytes to avoid hard crashes.
  const size_t n = std::min(static_cast<size_t>(count), bytes_remaining_);
  cord->Append(absl::Cord::AdvanceAndRead(&it_, n));

  // Update current chunk data.
  bytes_remaining_ -= n;
  LoadChunkData();

  return n == static_cast<size_t>(count);
}